

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

void ctemplate::AssertExpandWithCacheIs
               (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
               PerExpandData *per_expand_data,string *is,bool expected)

{
  char *__s2;
  __type _Var1;
  int iVar2;
  char *__s1;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s1 = ExpandWithCacheIs(cache,filename,strip,dict,per_expand_data,expected);
  __s2 = (is->_M_dataplus)._M_p;
  iVar2 = strcmp(__s1,__s2);
  if (iVar2 != 0) {
    printf("expected = \'%s\'\n",__s2);
    printf("actual   = \'%s\'\n",__s1);
  }
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  _Var1 = std::operator==(&local_40,is);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var1) {
    operator_delete__(__s1);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xdf,"string(buf) == is");
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  _Var1 = std::operator==(&local_40,is);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  __assert_fail("string(buf) == is",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0xdf,
                "void ctemplate::AssertExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, const string &, bool)"
               );
}

Assistant:

void AssertExpandWithCacheIs(TemplateCache* cache,
                             const string& filename, Strip strip,
                             const TemplateDictionary *dict,
                             PerExpandData* per_expand_data,
                             const string& is, bool expected) {
  const char* buf = ExpandWithCacheIs(cache, filename, strip, dict,
                                      per_expand_data, expected);
  if (strcmp(buf, is.c_str())) {
    printf("expected = '%s'\n", is.c_str());
    printf("actual   = '%s'\n", buf);
  }
  ASSERT(string(buf) == is);
  delete [] buf;
}